

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

EVaction add_proto_action(CManager_conflict cm,stone_type stone,proto_action **act)

{
  attr_list *pp_Var1;
  undefined8 *puVar2;
  void **ppvVar3;
  int iVar4;
  _proto_action *p_Var5;
  long lVar6;
  
  iVar4 = stone->proto_action_count;
  lVar6 = (long)iVar4;
  p_Var5 = (_proto_action *)INT_CMrealloc(stone->proto_actions,lVar6 * 0x60 + 0x60);
  stone->proto_actions = p_Var5;
  *(undefined8 *)(p_Var5 + lVar6) = 0;
  p_Var5[lVar6].input_format_requirements = (FMStructDescList)0x0;
  p_Var5[lVar6].attrs = (attr_list)0x0;
  (&p_Var5[lVar6].attrs)[1] = (attr_list)0x0;
  pp_Var1 = &p_Var5[lVar6].o.bri.remote_contact;
  *pp_Var1 = (attr_list)0x0;
  pp_Var1[1] = (attr_list)0x0;
  puVar2 = (undefined8 *)((long)&p_Var5[lVar6].o + 0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  ppvVar3 = &p_Var5[lVar6].o.term.client_data;
  *ppvVar3 = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  p_Var5[lVar6].matching_reference_formats = (FMFormat *)0x0;
  (((anon_union_48_6_c1ce387a_for_o *)(&p_Var5[lVar6].matching_reference_formats + 1))->term).
  handler = (EVSimpleHandlerFunc)0x0;
  stone->proto_action_count = stone->proto_action_count + 1;
  *act = stone->proto_actions + lVar6;
  return iVar4;
}

Assistant:

EVaction
add_proto_action(CManager cm, stone_type stone, proto_action **act)
{
    int proto_action_num = stone->proto_action_count;
    (void)cm;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (proto_action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[proto_action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    ++stone->proto_action_count;
    *act = &stone->proto_actions[proto_action_num];
    return proto_action_num;
}